

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

int str_packsize(lua_State *L)

{
  KOption KVar1;
  ulong totalsize;
  ulong uVar2;
  uint ntoalign;
  char *fmt;
  Header h;
  uint local_54;
  char *local_50;
  size_t local_48;
  Header local_40;
  
  totalsize = 0;
  local_50 = luaL_checklstring(L,1,(size_t *)0x0);
  local_40.islittle = 1;
  local_40.maxalign = 1;
  local_40.L = L;
  if (*local_50 != '\0') {
    totalsize = 0;
    do {
      KVar1 = getdetails(&local_40,totalsize,&local_50,&local_48,&local_54);
      if (0xfffffffd < KVar1 - Kpadding) {
        luaL_argerror(L,1,"variable-length format");
      }
      uVar2 = local_54 + local_48;
      if ((uVar2 ^ 0x7fffffffffffffff) < totalsize) {
        luaL_argerror(L,1,"format result too large");
      }
      totalsize = totalsize + uVar2;
    } while (*local_50 != '\0');
  }
  lua_pushinteger(L,totalsize);
  return 1;
}

Assistant:

static int str_packsize (lua_State *L) {
  Header h;
  const char *fmt = luaL_checkstring(L, 1);  /* format string */
  size_t totalsize = 0;  /* accumulate total size of result */
  initheader(L, &h);
  while (*fmt != '\0') {
    unsigned ntoalign;
    size_t size;
    KOption opt = getdetails(&h, totalsize, &fmt, &size, &ntoalign);
    luaL_argcheck(L, opt != Kstring && opt != Kzstr, 1,
                     "variable-length format");
    size += ntoalign;  /* total space used by option */
    luaL_argcheck(L, totalsize <= LUA_MAXINTEGER - size,
                     1, "format result too large");
    totalsize += size;
  }
  lua_pushinteger(L, cast_st2S(totalsize));
  return 1;
}